

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx2.cpp
# Opt level: O0

void __thiscall ncnn::LSTM_x86_avx2::LSTM_x86_avx2(LSTM_x86_avx2 *this)

{
  long *in_RDI;
  LSTM *unaff_retaddr;
  
  LSTM::LSTM(unaff_retaddr);
  *in_RDI = (long)&PTR_create_pipeline_009c51e8;
  in_RDI[0x13] = (long)&PTR__LSTM_x86_avx2_009c5268;
  Mat::Mat((Mat *)(in_RDI + 1));
  Mat::Mat((Mat *)(in_RDI + 10));
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x11) = 1;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 8) = 0;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 9) = 0;
  return;
}

Assistant:

LSTM_x86_avx2::LSTM_x86_avx2()
{
#ifdef __AVX2__
    support_weight_fp16_storage = true;
#endif
    one_blob_only = false;
    support_inplace = false;
}